

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRr.c
# Opt level: O2

int Abc_NtkRRWindow(Abc_RRMan_t *p)

{
  Vec_Ptr_t *pVVar1;
  Vec_Ptr_t *pVVar2;
  Abc_Obj_t *p_00;
  Abc_Ntk_t *pNtk;
  Vec_Ptr_t *p_01;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  void *pvVar8;
  long *plVar9;
  Abc_Obj_t *pAVar10;
  Abc_Obj_t *pAVar11;
  Abc_Ntk_t *pNtk_00;
  char *pcVar12;
  Abc_Obj_t *pAVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  
  pAVar11 = p->pFanout;
  pAVar13 = pAVar11;
  if (pAVar11 == (Abc_Obj_t *)0x0) {
    pAVar13 = p->pNode;
  }
  pAVar11 = (&p->pNode)[pAVar11 == (Abc_Obj_t *)0x0];
  iVar14 = (*(uint *)&p->pFanin->field_0x14 >> 0xc) - p->nFaninLevels;
  if (iVar14 < 1) {
    iVar14 = 0;
  }
  uVar5 = (*(uint *)&pAVar13->field_0x14 >> 0xc) + p->nFanoutLevels;
  Abc_NtkIncrementTravId(p->pNtk);
  Abc_NodeSetTravIdCurrent(p->pFanin);
  Vec_PtrPush(p->vFaninLeaves,p->pFanin);
  do {
    pVVar1 = p->vFaninLeaves;
    uVar17 = 0;
    for (iVar15 = 0; iVar16 = pVVar1->nSize, iVar15 < iVar16; iVar15 = iVar15 + 1) {
      pvVar8 = Vec_PtrEntry(pVVar1,iVar15);
      uVar6 = *(uint *)((long)pvVar8 + 0x14) >> 0xc;
      if (uVar17 <= uVar6) {
        uVar17 = uVar6;
      }
    }
    if ((int)uVar17 <= iVar14) break;
    iVar15 = 0;
    if (iVar16 < 1) {
      iVar16 = 0;
    }
    for (; iVar15 != iVar16; iVar15 = iVar15 + 1) {
      plVar9 = (long *)Vec_PtrEntry(pVVar1,iVar15);
      if (uVar17 == *(uint *)((long)plVar9 + 0x14) >> 0xc) {
        for (lVar18 = 0; lVar18 < *(int *)((long)plVar9 + 0x1c); lVar18 = lVar18 + 1) {
          pAVar10 = *(Abc_Obj_t **)
                     (*(long *)(*(long *)(*plVar9 + 0x20) + 8) +
                     (long)*(int *)(plVar9[4] + lVar18 * 4) * 8);
          iVar7 = Abc_NodeIsTravIdCurrent(pAVar10);
          if (iVar7 == 0) {
            Abc_NodeSetTravIdCurrent(pAVar10);
            Vec_PtrPush(pVVar1,pAVar10);
          }
        }
      }
    }
    iVar15 = 0;
    for (iVar16 = 0; iVar16 < pVVar1->nSize; iVar16 = iVar16 + 1) {
      pvVar8 = Vec_PtrEntry(pVVar1,iVar16);
      if (uVar17 != *(uint *)((long)pvVar8 + 0x14) >> 0xc) {
        Vec_PtrWriteEntry(pVVar1,iVar15,pvVar8);
        iVar15 = iVar15 + 1;
      }
    }
    Vec_PtrShrink(pVVar1,iVar15);
  } while (pVVar1->nSize < 0x7d1);
  Abc_NtkIncrementTravId(p->pNtk);
  for (iVar15 = 0; iVar15 < p->vFaninLeaves->nSize; iVar15 = iVar15 + 1) {
    pAVar10 = (Abc_Obj_t *)Vec_PtrEntry(p->vFaninLeaves,iVar15);
    Abc_NodeSetTravIdCurrent(pAVar10);
  }
  do {
    pVVar1 = p->vFaninLeaves;
    pVVar2 = p->vFanoutRoots;
    uVar17 = 1000000000;
    for (iVar15 = 0; iVar16 = pVVar1->nSize, iVar15 < iVar16; iVar15 = iVar15 + 1) {
      pvVar8 = Vec_PtrEntry(pVVar1,iVar15);
      uVar6 = *(uint *)((long)pvVar8 + 0x14) >> 0xc;
      if (uVar6 <= uVar17) {
        uVar17 = uVar6;
      }
    }
    if ((int)uVar5 < (int)uVar17) break;
    iVar15 = 0;
    if (iVar16 < 1) {
      iVar16 = iVar15;
    }
    for (; iVar15 != iVar16; iVar15 = iVar15 + 1) {
      pAVar10 = (Abc_Obj_t *)Vec_PtrEntry(pVVar1,iVar15);
      if (uVar17 == *(uint *)&pAVar10->field_0x14 >> 0xc) {
        bVar3 = false;
        for (lVar18 = 0; lVar18 < (pAVar10->vFanouts).nSize; lVar18 = lVar18 + 1) {
          p_00 = (Abc_Obj_t *)pAVar10->pNtk->vObjs->pArray[(pAVar10->vFanouts).pArray[lVar18]];
          bVar4 = true;
          if ((((*(uint *)&p_00->field_0x14 >> 0xc <= uVar5) &&
               (1 < (*(uint *)&p_00->field_0x14 & 0xf) - 3)) &&
              ((bVar4 = bVar3, pAVar10 != pAVar11 || (p_00 != pAVar13)))) &&
             (iVar7 = Abc_NodeIsTravIdCurrent(p_00), iVar7 == 0)) {
            Abc_NodeSetTravIdCurrent(p_00);
            Vec_PtrPush(pVVar1,p_00);
          }
          bVar3 = bVar4;
        }
        if (bVar3) {
          Vec_PtrPush(pVVar2,pAVar10);
        }
      }
    }
    iVar15 = 0;
    for (iVar16 = 0; iVar16 < pVVar1->nSize; iVar16 = iVar16 + 1) {
      pvVar8 = Vec_PtrEntry(pVVar1,iVar16);
      if (uVar17 != *(uint *)((long)pvVar8 + 0x14) >> 0xc) {
        Vec_PtrWriteEntry(pVVar1,iVar15,pvVar8);
        iVar15 = iVar15 + 1;
      }
    }
    Vec_PtrShrink(pVVar1,iVar15);
  } while (pVVar1->nSize < 0x7d1);
  for (iVar15 = 0; iVar15 < p->vFanoutRoots->nSize; iVar15 = iVar15 + 1) {
    pvVar8 = Vec_PtrEntry(p->vFanoutRoots,iVar15);
    *(byte *)((long)pvVar8 + 0x14) = *(byte *)((long)pvVar8 + 0x14) | 0x10;
  }
  iVar15 = Abc_NtkRRTfo_rec(pAVar13,p->vRoots,uVar5 + 1);
  for (iVar16 = 0; iVar16 < p->vFanoutRoots->nSize; iVar16 = iVar16 + 1) {
    pvVar8 = Vec_PtrEntry(p->vFanoutRoots,iVar16);
    *(byte *)((long)pvVar8 + 0x14) = *(byte *)((long)pvVar8 + 0x14) & 0xef;
  }
  if (iVar15 == 0) {
    iVar14 = 0;
  }
  else {
    Abc_NtkIncrementTravId(p->pNtk);
    for (iVar15 = 0; pVVar1 = p->vRoots, iVar15 < pVVar1->nSize; iVar15 = iVar15 + 1) {
      pAVar11 = (Abc_Obj_t *)Vec_PtrEntry(pVVar1,iVar15);
      Abc_NtkRRTfi_rec(pAVar11,p->vLeaves,p->vCone,iVar14);
    }
    pNtk = p->pNtk;
    if (pNtk->ntkType != ABC_NTK_STRASH) {
      __assert_fail("Abc_NtkIsStrash(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRr.c"
                    ,0x2aa,
                    "Abc_Ntk_t *Abc_NtkWindow(Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)");
    }
    pVVar2 = p->vLeaves;
    p_01 = p->vCone;
    pNtk_00 = Abc_NtkAlloc(ABC_NTK_STRASH,pNtk->ntkFunc,1);
    pcVar12 = Extra_UtilStrsav("temp");
    pNtk_00->pName = pcVar12;
    pAVar11 = Abc_AigConst1(pNtk_00);
    pAVar13 = Abc_AigConst1(pNtk);
    (pAVar13->field_6).pCopy = pAVar11;
    for (iVar14 = 0; iVar14 < pVVar2->nSize; iVar14 = iVar14 + 1) {
      pvVar8 = Vec_PtrEntry(pVVar2,iVar14);
      pAVar11 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PI);
      *(Abc_Obj_t **)((long)pvVar8 + 0x40) = pAVar11;
    }
    for (iVar14 = 0; iVar15 = p_01->nSize, iVar14 < iVar15; iVar14 = iVar14 + 1) {
      plVar9 = (long *)Vec_PtrEntry(p_01,iVar14);
      lVar18 = *(long *)(*(long *)(*plVar9 + 0x20) + 8);
      pAVar11 = Abc_AigAnd((Abc_Aig_t *)pNtk_00->pManFunc,
                           (Abc_Obj_t *)
                           ((ulong)(*(uint *)((long)plVar9 + 0x14) >> 10 & 1) ^
                           *(ulong *)(*(long *)(lVar18 + (long)*(int *)plVar9[4] * 8) + 0x40)),
                           (Abc_Obj_t *)
                           ((ulong)(*(uint *)((long)plVar9 + 0x14) >> 0xb & 1) ^
                           *(ulong *)(*(long *)(lVar18 + (long)((int *)plVar9[4])[1] * 8) + 0x40)));
      plVar9[8] = (long)pAVar11;
    }
    if (iVar15 != pNtk_00->nObjCounts[7]) {
      printf("Warning: Structural hashing during windowing reduced %d nodes (this is a bug).\n");
    }
    for (iVar14 = 0; iVar14 < pVVar1->nSize; iVar14 = iVar14 + 1) {
      pvVar8 = Vec_PtrEntry(pVVar1,iVar14);
      if ((*(byte *)((long)pvVar8 + 0x40) & 1) != 0) {
        __assert_fail("!Abc_ObjIsComplement(pObj->pCopy)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRr.c"
                      ,0x2be,
                      "Abc_Ntk_t *Abc_NtkWindow(Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                     );
      }
      pAVar11 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PO);
      Abc_ObjAddFanin(pAVar11,*(Abc_Obj_t **)((long)pvVar8 + 0x40));
    }
    Abc_NtkAddDummyPiNames(pNtk_00);
    Abc_NtkAddDummyPoNames(pNtk_00);
    iVar14 = Abc_NtkCheck(pNtk_00);
    if (iVar14 == 0) {
      puts("Abc_NtkWindow: The network check has failed.");
      pNtk_00 = (Abc_Ntk_t *)0x0;
    }
    p->pWnd = pNtk_00;
    iVar14 = 1;
  }
  return iVar14;
}

Assistant:

int Abc_NtkRRWindow( Abc_RRMan_t * p )
{
    Abc_Obj_t * pObj, * pEdgeFanin, * pEdgeFanout;
    int i, LevelMin, LevelMax, RetValue;

    // get the edge
    pEdgeFanout = p->pFanout? p->pFanout : p->pNode;
    pEdgeFanin  = p->pFanout? p->pNode : p->pFanin;
    // get the minimum and maximum levels of the window
    LevelMin = Abc_MaxInt( 0, ((int)p->pFanin->Level) - p->nFaninLevels );
    LevelMax = (int)pEdgeFanout->Level + p->nFanoutLevels;

    // start the TFI leaves with the fanin
    Abc_NtkIncrementTravId( p->pNtk );
    Abc_NodeSetTravIdCurrent( p->pFanin );
    Vec_PtrPush( p->vFaninLeaves, p->pFanin );
    // mark the TFI cone and collect the leaves down to the given level
    while ( Abc_NtkRRTfi_int(p->vFaninLeaves, LevelMin) );

    // mark the leaves with the new TravId
    Abc_NtkIncrementTravId( p->pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vFaninLeaves, pObj, i )
        Abc_NodeSetTravIdCurrent( pObj );
    // traverse the TFO cone of the leaves (while skipping the edge)
    // (a) mark the nodes in the cone using the current TravId
    // (b) collect the nodes that have external fanouts into p->vFanoutRoots
    while ( Abc_NtkRRTfo_int(p->vFaninLeaves, p->vFanoutRoots, LevelMax, pEdgeFanin, pEdgeFanout) );

    // mark the fanout roots
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vFanoutRoots, pObj, i )
        pObj->fMarkA = 1;
    // collect roots reachable from the fanout (p->vRoots)
    RetValue = Abc_NtkRRTfo_rec( pEdgeFanout, p->vRoots, LevelMax + 1 );
    // unmark the fanout roots
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vFanoutRoots, pObj, i )
        pObj->fMarkA = 0;

    // return if the window is infeasible
    if ( RetValue == 0 )
        return 0;

    // collect the DFS-ordered new cone (p->vCone) and new leaves (p->vLeaves)
    // using the previous marks coming from the TFO cone
    Abc_NtkIncrementTravId( p->pNtk );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vRoots, pObj, i )
        Abc_NtkRRTfi_rec( pObj, p->vLeaves, p->vCone, LevelMin );

    // create a new network
    p->pWnd = Abc_NtkWindow( p->pNtk, p->vLeaves, p->vCone, p->vRoots );
    return 1;
}